

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O3

void utest_filewatcher_add_watch_modify_1(int *utest_result,size_t utest_index)

{
  int iVar1;
  HFileWatcher handle;
  int *piVar2;
  char *pcVar3;
  bool callback_called;
  ofstream file;
  char local_229;
  timespec local_228;
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  std::ofstream::ofstream((ostream *)&local_218,"test_file.txt",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"File dummy content",0x12);
  std::ofstream::close();
  local_229 = '\0';
  handle = FileWatcherCreate(OnFileChanged,&local_229,0x10);
  FileWatcherAddWatch(handle,"test_file.txt");
  local_228.tv_sec = 0;
  local_228.tv_nsec = 100000000;
  do {
    iVar1 = nanosleep(&local_228,&local_228);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (local_229 == '\x01') {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x5b);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x5b);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar3 = "true";
      if (local_229 != '\0') {
        pcVar3 = "false";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar3);
    }
    pcVar3 = "true";
    if (local_229 != '\0') {
      pcVar3 = "false";
    }
    printf("    Actual : %s\n",pcVar3);
    *utest_result = 1;
  }
  FileWatcherRemoveWatch(handle,"test_file.txt");
  FileWatcherDestroy(handle);
  remove("test_file.txt");
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

UTEST(filewatcher, add_watch_modify_1) {
    const char* file_path = "test_file.txt";
    std::ofstream file(file_path);
    file << "File dummy content";
    file.close();

    bool callback_called = false;
    HFileWatcher watcher = FileWatcherCreate(OnFileChanged, &callback_called, 16);
    FileWatcherAddWatch(watcher, file_path);

    std::this_thread::sleep_for(std::chrono::milliseconds(100));

    T(!callback_called);

    FileWatcherRemoveWatch(watcher, file_path);
    FileWatcherDestroy(watcher);

    std::remove(file_path);
}